

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *in,QHostAddress *address)

{
  QString *id;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  int i;
  QString scope;
  quint32 ipv4;
  qint8 prot;
  Q_IPV6ADDR ipv6;
  Q_IPV6ADDR *in_stack_ffffffffffffff98;
  QDataStream *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  int index;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_20;
  char local_19;
  QIPv6Address local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = -0x56;
  QDataStream::operator>>(in_RDI,&local_19);
  id = (QString *)(ulong)((int)local_19 + 1);
  switch(id) {
  case (QString *)0x0:
    QHostAddress::clear((QHostAddress *)in_stack_ffffffffffffffa0);
    break;
  case (QString *)0x1:
    local_20 = 0xaaaaaaaa;
    QDataStream::operator>>(in_stack_ffffffffffffffa0,(quint32 *)in_stack_ffffffffffffff98);
    QHostAddress::setAddress
              ((QHostAddress *)in_stack_ffffffffffffffa0,
               (quint32)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    break;
  case (QString *)0x2:
    local_18.c[0] = 0xaa;
    local_18.c[1] = 0xaa;
    local_18.c[2] = 0xaa;
    local_18.c[3] = 0xaa;
    local_18.c[4] = 0xaa;
    local_18.c[5] = 0xaa;
    local_18.c[6] = 0xaa;
    local_18.c[7] = 0xaa;
    local_18.c[8] = 0xaa;
    local_18.c[9] = 0xaa;
    local_18.c[10] = 0xaa;
    local_18.c[0xb] = 0xaa;
    local_18.c[0xc] = 0xaa;
    local_18.c[0xd] = 0xaa;
    local_18.c[0xe] = 0xaa;
    local_18.c[0xf] = 0xaa;
    for (index = 0; index < 0x10; index = index + 1) {
      in_stack_ffffffffffffffa0 = in_RDI;
      QIPv6Address::operator[](&local_18,index);
      QDataStream::operator>>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98->c);
    }
    QHostAddress::setAddress((QHostAddress *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    local_28 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x218a40);
    operator>>(in_RDI,(QString *)&local_38);
    QHostAddress::setScopeId((QHostAddress *)CONCAT44(index,in_stack_ffffffffffffffb0),id);
    QString::~QString((QString *)0x218a68);
    break;
  case (QString *)0x3:
    QHostAddress::operator=
              ((QHostAddress *)in_stack_ffffffffffffffa0,
               (SpecialAddress)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    break;
  default:
    QHostAddress::clear((QHostAddress *)in_stack_ffffffffffffffa0);
    QDataStream::setStatus((Status)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &operator>>(QDataStream &in, QHostAddress &address)
{
    qint8 prot;
    in >> prot;
    switch (QHostAddress::NetworkLayerProtocol(prot)) {
    case QHostAddress::UnknownNetworkLayerProtocol:
        address.clear();
        break;
    case QHostAddress::IPv4Protocol:
    {
        quint32 ipv4;
        in >> ipv4;
        address.setAddress(ipv4);
    }
        break;
    case QHostAddress::IPv6Protocol:
    {
        Q_IPV6ADDR ipv6;
        for (int i = 0; i < 16; ++i)
            in >> ipv6[i];
        address.setAddress(ipv6);

        QString scope;
        in >> scope;
        address.setScopeId(scope);
    }
        break;
    case QHostAddress::AnyIPProtocol:
        address = QHostAddress::Any;
        break;
    default:
        address.clear();
        in.setStatus(QDataStream::ReadCorruptData);
    }
    return in;
}